

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_suffix_array.hpp
# Opt level: O1

bool check_lcp<unsigned_long>
               (string *str,vector<unsigned_long,_std::allocator<unsigned_long>_> *SA,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *ISA,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *LCP)

{
  pointer puVar1;
  ostream *poVar2;
  bool bVar3;
  ulong uVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ref_LCP;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lcp_from_sa<unsigned_long>(str,SA,ISA,&local_48);
  if ((long)(LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
    puVar1 = (LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish == puVar1) {
      bVar3 = true;
    }
    else {
      bVar3 = true;
      uVar4 = 0;
      do {
        if (puVar1[uVar4] !=
            local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4]) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"[ERROR] LCP[",0xc);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]=",2);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," != ",4);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=ref_LCP[",9);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          bVar3 = false;
        }
        uVar4 = uVar4 + 1;
        puVar1 = (LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar4 < (ulong)((long)(LCP->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3
                              ));
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[ERROR] LCP size is wrong: ",0x1b);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"!=",2);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    bVar3 = false;
  }
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool check_lcp(const std::string& str, const std::vector<index_t>& SA, const std::vector<index_t>& ISA, const std::vector<index_t>& LCP)
{
    // construct reference LCP (sequentially)
    std::vector<index_t> ref_LCP;
    lcp_from_sa(str, SA, ISA, ref_LCP);

    // check if reference is equal to this LCP
    if (LCP.size() != ref_LCP.size())
    {
        std::cerr << "[ERROR] LCP size is wrong: " << LCP.size() << "!=" << ref_LCP.size() << std::endl;
        return false;
    }
    // check that all LCP values are equal
    bool all_correct = true;
    for (std::size_t i = 0; i < LCP.size(); ++i)
    {
        if (LCP[i] != ref_LCP[i])
        {
            std::cerr << "[ERROR] LCP[" << i << "]=" << LCP[i] << " != " << ref_LCP[i] << "=ref_LCP[" << i << "]" << std::endl;
            all_correct = false;
        }
    }
    return all_correct;
}